

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_fast.c
# Opt level: O1

size_t ZSTD_compressBlock_fast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  BYTE *pBVar6;
  U32 *pUVar7;
  seqDef *psVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  BYTE *pStart_1;
  ulong uVar12;
  long *plVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  long *plVar17;
  ulong uVar18;
  int *piVar19;
  ulong uVar20;
  ulong *puVar21;
  BYTE *ip;
  long *plVar22;
  int *piVar23;
  long lVar24;
  long *plVar25;
  uint uVar26;
  BYTE *pInLoopLimit_4;
  ulong uVar27;
  BYTE *pStart_4;
  uint uVar28;
  uint uVar29;
  BYTE *pStart_2;
  ulong uVar30;
  ulong *puVar31;
  BYTE *op;
  int *piVar32;
  ulong *puVar33;
  ulong uVar34;
  U32 UVar35;
  ulong uVar36;
  uint local_ac;
  int local_a8;
  BYTE *base;
  BYTE *ilimit;
  BYTE *iend;
  U32 *hashTable;
  U32 prefixStartIndex;
  BYTE *prefixStart;
  size_t stepSize;
  
  uVar11 = (ms->cParams).targetLength;
  uVar12 = (ulong)(uVar11 + 1 + (uint)(uVar11 == 0));
  pBVar6 = (ms->window).base;
  uVar11 = (ms->window).dictLimit;
  piVar23 = (int *)(pBVar6 + uVar11);
  puVar2 = (ulong *)((long)src + srcSize);
  plVar13 = (long *)((long)src + (srcSize - 8));
  uVar3 = rep[1];
  plVar22 = (long *)((long)src + (ulong)(piVar23 == (int *)src));
  uVar26 = (int)plVar22 - (int)piVar23;
  local_ac = uVar3;
  if (uVar26 < uVar3) {
    local_ac = 0;
  }
  uVar4 = *rep;
  uVar10 = 0;
  if (uVar4 <= uVar26) {
    uVar10 = uVar4;
  }
  plVar25 = (long *)((long)src + (ulong)(piVar23 == (int *)src) + 1);
  uVar28 = (ms->cParams).minMatch;
  pUVar7 = ms->hashTable;
  local_a8 = (int)pBVar6;
  if (uVar28 == 5) {
    if (plVar25 < plVar13) {
      bVar14 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      do {
        uVar30 = (ulong)(*plVar22 * -0x30e4432345000000) >> (bVar14 & 0x3f);
        uVar18 = (ulong)(*plVar25 * -0x30e4432345000000) >> (bVar14 & 0x3f);
        lVar24 = *plVar22;
        lVar9 = *plVar25;
        uVar36 = (long)plVar22 - (long)pBVar6;
        uVar28 = pUVar7[uVar30];
        uVar5 = pUVar7[uVar18];
        UVar35 = (U32)uVar36;
        pUVar7[uVar30] = UVar35;
        pUVar7[uVar18] = (int)plVar25 - local_a8;
        if (uVar10 == 0) {
LAB_00110e6a:
          if (((uVar11 < uVar28) &&
              (piVar19 = (int *)(pBVar6 + uVar28), plVar17 = plVar22, *piVar19 == (int)lVar24)) ||
             ((uVar11 < uVar5 &&
              (piVar19 = (int *)(pBVar6 + uVar5), plVar17 = plVar25, *piVar19 == (int)lVar9)))) {
            uVar28 = (int)plVar17 - (int)piVar19;
            iVar15 = uVar28 + 2;
            local_ac = uVar10;
            if ((piVar23 < piVar19) && (src < plVar17)) {
              uVar18 = 0;
              do {
                plVar22 = (long *)((long)plVar17 + -1);
                piVar32 = (int *)((long)piVar19 + -1);
                if ((*(char *)plVar22 != *(char *)piVar32) ||
                   (uVar18 = uVar18 + 1, piVar19 = piVar32, plVar17 = plVar22, piVar32 <= piVar23))
                break;
              } while (src < plVar22);
            }
            else {
              uVar18 = 0;
            }
            goto LAB_00110f1b;
          }
          lVar24 = ((long)plVar22 - (long)src >> 7) + uVar12;
          plVar22 = (long *)((long)plVar22 + lVar24);
          plVar25 = (long *)((long)plVar25 + lVar24);
        }
        else {
          piVar19 = (int *)((long)plVar22 + (2 - (ulong)uVar10));
          if (*piVar19 != *(int *)((long)plVar22 + 2)) goto LAB_00110e6a;
          uVar18 = (ulong)(*(char *)((long)plVar22 + 1) == *(char *)((long)piVar19 + -1));
          iVar15 = 0;
          piVar19 = (int *)((long)piVar19 - uVar18);
          plVar17 = (long *)((long)plVar22 + (2 - uVar18));
          uVar28 = uVar10;
LAB_00110f1b:
          uVar10 = uVar28;
          puVar33 = (ulong *)((long)plVar17 + uVar18 + 4);
          puVar21 = (ulong *)((long)piVar19 + uVar18 + 4);
          puVar31 = puVar33;
          if (puVar33 < puVar1) {
            uVar27 = *puVar33 ^ *puVar21;
            uVar30 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar30 = uVar30 >> 3 & 0x1fffffff;
            if (*puVar21 == *puVar33) {
              puVar31 = (ulong *)((long)plVar17 + uVar18 + 0xc);
              puVar21 = (ulong *)((long)piVar19 + uVar18 + 0xc);
              do {
                if (puVar1 <= puVar31) goto LAB_00110f9b;
                uVar27 = *puVar21;
                uVar34 = *puVar31;
                uVar20 = uVar34 ^ uVar27;
                uVar30 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = (long)puVar31 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar33);
                puVar31 = puVar31 + 1;
                puVar21 = puVar21 + 1;
              } while (uVar27 == uVar34);
            }
          }
          else {
LAB_00110f9b:
            if ((puVar31 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar21 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar31 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar21 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar31 < puVar2) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar21 == (char)*puVar31));
            }
            uVar30 = (long)puVar31 - (long)puVar33;
          }
          uVar27 = (long)plVar17 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar22 = (long *)((long)plVar25 + uVar27);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar22);
          seqStore->lit = seqStore->lit + uVar27;
          if (0xffff < uVar27) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar34 = (uVar18 + 4 + uVar30) - 3;
          psVar8 = seqStore->sequences;
          psVar8->litLength = (U16)uVar27;
          psVar8->offset = iVar15 + 1;
          if (0xffff < uVar34) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar24 = uVar18 + 4 + uVar30;
          psVar8->matchLength = (U16)uVar34;
          seqStore->sequences = psVar8 + 1;
          plVar22 = (long *)((long)plVar17 + lVar24);
          plVar25 = (long *)((long)plVar17 + lVar24 + 1);
          src = plVar22;
          if (plVar22 <= plVar13) {
            pUVar7[(ulong)(*(long *)(pBVar6 + (uVar36 & 0xffffffff) + 2) * -0x30e4432345000000) >>
                   (bVar14 & 0x3f)] = UVar35 + 2;
            pUVar7[(ulong)(*(long *)((long)plVar22 - 2) * -0x30e4432345000000) >> (bVar14 & 0x3f)] =
                 ((int)plVar22 + -2) - local_a8;
            if ((local_ac != 0) &&
               (uVar18 = (ulong)local_ac, uVar28 = uVar10,
               (int)*plVar22 == *(int *)((long)plVar22 - uVar18))) {
              do {
                uVar10 = local_ac;
                local_ac = uVar28;
                plVar25 = plVar22;
                puVar31 = (ulong *)((long)plVar25 + 4);
                puVar33 = (ulong *)((long)plVar25 + (4 - uVar18));
                puVar21 = puVar31;
                if (puVar31 < puVar1) {
                  uVar36 = *puVar31 ^ *puVar33;
                  uVar30 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = uVar30 >> 3 & 0x1fffffff;
                  if (*puVar33 == *puVar31) {
                    puVar21 = (ulong *)((long)plVar25 + 0xc);
                    puVar33 = (ulong *)((long)plVar25 + (0xc - uVar18));
                    do {
                      if (puVar1 <= puVar21) goto LAB_00111164;
                      uVar18 = *puVar33;
                      uVar36 = *puVar21;
                      uVar27 = uVar36 ^ uVar18;
                      uVar30 = 0;
                      if (uVar27 != 0) {
                        for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                        }
                      }
                      uVar30 = (long)puVar21 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar31);
                      puVar21 = puVar21 + 1;
                      puVar33 = puVar33 + 1;
                    } while (uVar18 == uVar36);
                  }
                }
                else {
LAB_00111164:
                  if ((puVar21 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar33 == (int)*puVar21))
                  {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar21 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar33 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar21 < puVar2) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar33 == (char)*puVar21));
                  }
                  uVar30 = (long)puVar21 - (long)puVar31;
                }
                pUVar7[(ulong)(*plVar25 * -0x30e4432345000000) >> (bVar14 & 0x3f)] =
                     (int)plVar25 - local_a8;
                *(long *)seqStore->lit = *plVar25;
                psVar8 = seqStore->sequences;
                psVar8->litLength = 0;
                psVar8->offset = 1;
                if (0xffff < uVar30 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar22 = (long *)((long)plVar25 + uVar30 + 4);
                psVar8->matchLength = (U16)(uVar30 + 1);
                seqStore->sequences = psVar8 + 1;
              } while (((plVar22 <= plVar13) && (local_ac != 0)) &&
                      (uVar28 = uVar10, uVar18 = (ulong)local_ac,
                      (int)*plVar22 == *(int *)((long)plVar22 - (ulong)local_ac)));
              plVar25 = (long *)((long)plVar25 + uVar30 + 5);
              src = plVar22;
            }
          }
        }
      } while (plVar25 < plVar13);
    }
  }
  else if (uVar28 == 6) {
    if (plVar25 < plVar13) {
      bVar14 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      do {
        uVar30 = (ulong)(*plVar22 * -0x30e4432340650000) >> (bVar14 & 0x3f);
        uVar18 = (ulong)(*plVar25 * -0x30e4432340650000) >> (bVar14 & 0x3f);
        lVar24 = *plVar22;
        lVar9 = *plVar25;
        uVar36 = (long)plVar22 - (long)pBVar6;
        uVar28 = pUVar7[uVar30];
        uVar5 = pUVar7[uVar18];
        UVar35 = (U32)uVar36;
        pUVar7[uVar30] = UVar35;
        pUVar7[uVar18] = (int)plVar25 - local_a8;
        if (uVar10 == 0) {
LAB_001109b3:
          if (((uVar11 < uVar28) &&
              (piVar19 = (int *)(pBVar6 + uVar28), plVar17 = plVar22, *piVar19 == (int)lVar24)) ||
             ((uVar11 < uVar5 &&
              (piVar19 = (int *)(pBVar6 + uVar5), plVar17 = plVar25, *piVar19 == (int)lVar9)))) {
            uVar28 = (int)plVar17 - (int)piVar19;
            iVar15 = uVar28 + 2;
            local_ac = uVar10;
            if ((piVar23 < piVar19) && (src < plVar17)) {
              uVar18 = 0;
              do {
                piVar32 = (int *)((long)piVar19 + -1);
                plVar22 = (long *)((long)plVar17 + -1);
                if ((*(char *)plVar22 != *(char *)piVar32) ||
                   (uVar18 = uVar18 + 1, plVar17 = plVar22, piVar19 = piVar32, piVar32 <= piVar23))
                break;
              } while (src < plVar22);
            }
            else {
              uVar18 = 0;
            }
            goto LAB_00110a69;
          }
          lVar24 = ((long)plVar22 - (long)src >> 7) + uVar12;
          plVar22 = (long *)((long)plVar22 + lVar24);
          plVar25 = (long *)((long)plVar25 + lVar24);
        }
        else {
          piVar19 = (int *)((long)plVar22 + (2 - (ulong)uVar10));
          if (*piVar19 != *(int *)((long)plVar22 + 2)) goto LAB_001109b3;
          uVar18 = (ulong)(*(char *)((long)plVar22 + 1) == *(char *)((long)piVar19 + -1));
          iVar15 = 0;
          plVar17 = (long *)((long)plVar22 + (2 - uVar18));
          piVar19 = (int *)((long)piVar19 - uVar18);
          uVar28 = uVar10;
LAB_00110a69:
          uVar10 = uVar28;
          puVar33 = (ulong *)((long)plVar17 + uVar18 + 4);
          puVar21 = (ulong *)((long)piVar19 + uVar18 + 4);
          puVar31 = puVar33;
          if (puVar33 < puVar1) {
            uVar27 = *puVar33 ^ *puVar21;
            uVar30 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar30 = uVar30 >> 3 & 0x1fffffff;
            if (*puVar21 == *puVar33) {
              puVar31 = (ulong *)((long)plVar17 + uVar18 + 0xc);
              puVar21 = (ulong *)((long)piVar19 + uVar18 + 0xc);
              do {
                if (puVar1 <= puVar31) goto LAB_00110ae9;
                uVar27 = *puVar21;
                uVar34 = *puVar31;
                uVar20 = uVar34 ^ uVar27;
                uVar30 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = (long)puVar31 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar33);
                puVar31 = puVar31 + 1;
                puVar21 = puVar21 + 1;
              } while (uVar27 == uVar34);
            }
          }
          else {
LAB_00110ae9:
            if ((puVar31 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar21 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar21 = (ulong *)((long)puVar21 + 4);
            }
            if ((puVar31 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar21 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar21 = (ulong *)((long)puVar21 + 2);
            }
            if (puVar31 < puVar2) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar21 == (char)*puVar31));
            }
            uVar30 = (long)puVar31 - (long)puVar33;
          }
          uVar27 = (long)plVar17 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar22 = (long *)((long)plVar25 + uVar27);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar22);
          seqStore->lit = seqStore->lit + uVar27;
          if (0xffff < uVar27) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar34 = (uVar18 + 4 + uVar30) - 3;
          psVar8 = seqStore->sequences;
          psVar8->litLength = (U16)uVar27;
          psVar8->offset = iVar15 + 1;
          if (0xffff < uVar34) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar24 = uVar18 + 4 + uVar30;
          psVar8->matchLength = (U16)uVar34;
          seqStore->sequences = psVar8 + 1;
          plVar22 = (long *)((long)plVar17 + lVar24);
          plVar25 = (long *)((long)plVar17 + lVar24 + 1);
          src = plVar22;
          if (plVar22 <= plVar13) {
            pUVar7[(ulong)(*(long *)(pBVar6 + (uVar36 & 0xffffffff) + 2) * -0x30e4432340650000) >>
                   (bVar14 & 0x3f)] = UVar35 + 2;
            pUVar7[(ulong)(*(long *)((long)plVar22 - 2) * -0x30e4432340650000) >> (bVar14 & 0x3f)] =
                 ((int)plVar22 + -2) - local_a8;
            if ((local_ac != 0) &&
               (uVar18 = (ulong)local_ac, (int)*plVar22 == *(int *)((long)plVar22 - uVar18))) {
              do {
                local_ac = uVar10;
                plVar25 = plVar22;
                uVar10 = (uint)uVar18;
                puVar31 = (ulong *)((long)plVar25 + 4);
                puVar33 = (ulong *)((long)plVar25 + (4 - uVar18));
                puVar21 = puVar31;
                if (puVar31 < puVar1) {
                  uVar36 = *puVar31 ^ *puVar33;
                  uVar30 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = uVar30 >> 3 & 0x1fffffff;
                  if (*puVar33 == *puVar31) {
                    puVar21 = (ulong *)((long)plVar25 + 0xc);
                    puVar33 = (ulong *)((long)plVar25 + (0xc - uVar18));
                    do {
                      if (puVar1 <= puVar21) goto LAB_00110cb2;
                      uVar18 = *puVar33;
                      uVar36 = *puVar21;
                      uVar27 = uVar36 ^ uVar18;
                      uVar30 = 0;
                      if (uVar27 != 0) {
                        for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                        }
                      }
                      uVar30 = (long)puVar21 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar31);
                      puVar21 = puVar21 + 1;
                      puVar33 = puVar33 + 1;
                    } while (uVar18 == uVar36);
                  }
                }
                else {
LAB_00110cb2:
                  if ((puVar21 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar33 == (int)*puVar21))
                  {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar21 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar33 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar21 < puVar2) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar33 == (char)*puVar21));
                  }
                  uVar30 = (long)puVar21 - (long)puVar31;
                }
                pUVar7[(ulong)(*plVar25 * -0x30e4432340650000) >> (bVar14 & 0x3f)] =
                     (int)plVar25 - local_a8;
                *(long *)seqStore->lit = *plVar25;
                psVar8 = seqStore->sequences;
                psVar8->litLength = 0;
                psVar8->offset = 1;
                if (0xffff < uVar30 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar22 = (long *)((long)plVar25 + uVar30 + 4);
                psVar8->matchLength = (U16)(uVar30 + 1);
                seqStore->sequences = psVar8 + 1;
              } while (((plVar22 <= plVar13) && (local_ac != 0)) &&
                      (uVar18 = (ulong)local_ac,
                      (int)*plVar22 == *(int *)((long)plVar22 - (ulong)local_ac)));
              plVar25 = (long *)((long)plVar25 + uVar30 + 5);
              src = plVar22;
            }
          }
        }
      } while (plVar25 < plVar13);
    }
  }
  else if (uVar28 == 7) {
    if (plVar25 < plVar13) {
      bVar14 = 0x40 - (char)(ms->cParams).hashLog;
      puVar1 = (ulong *)((long)puVar2 - 7);
      do {
        uVar30 = (ulong)(*plVar22 * -0x30e44323405a9d00) >> (bVar14 & 0x3f);
        uVar18 = (ulong)(*plVar25 * -0x30e44323405a9d00) >> (bVar14 & 0x3f);
        lVar24 = *plVar22;
        lVar9 = *plVar25;
        uVar36 = (long)plVar22 - (long)pBVar6;
        uVar28 = pUVar7[uVar30];
        uVar5 = pUVar7[uVar18];
        UVar35 = (U32)uVar36;
        pUVar7[uVar30] = UVar35;
        pUVar7[uVar18] = (int)plVar25 - local_a8;
        if (uVar10 == 0) {
LAB_001104e8:
          if (((uVar11 < uVar28) &&
              (piVar19 = (int *)(pBVar6 + uVar28), plVar17 = plVar22, *piVar19 == (int)lVar24)) ||
             ((uVar11 < uVar5 &&
              (piVar19 = (int *)(pBVar6 + uVar5), plVar17 = plVar25, *piVar19 == (int)lVar9)))) {
            uVar28 = (int)plVar17 - (int)piVar19;
            iVar15 = uVar28 + 2;
            local_ac = uVar10;
            if ((piVar23 < piVar19) && (src < plVar17)) {
              uVar18 = 0;
              do {
                piVar32 = (int *)((long)piVar19 + -1);
                plVar22 = (long *)((long)plVar17 + -1);
                if ((*(char *)plVar22 != *(char *)piVar32) ||
                   (uVar18 = uVar18 + 1, plVar17 = plVar22, piVar19 = piVar32, piVar32 <= piVar23))
                break;
              } while (src < plVar22);
            }
            else {
              uVar18 = 0;
            }
            goto LAB_0011059e;
          }
          lVar24 = ((long)plVar22 - (long)src >> 7) + uVar12;
          plVar22 = (long *)((long)plVar22 + lVar24);
          plVar25 = (long *)((long)plVar25 + lVar24);
        }
        else {
          piVar19 = (int *)((long)plVar22 + (2 - (ulong)uVar10));
          if (*piVar19 != *(int *)((long)plVar22 + 2)) goto LAB_001104e8;
          uVar18 = (ulong)(*(char *)((long)plVar22 + 1) == *(char *)((long)piVar19 + -1));
          iVar15 = 0;
          plVar17 = (long *)((long)plVar22 + (2 - uVar18));
          piVar19 = (int *)((long)piVar19 - uVar18);
          uVar28 = uVar10;
LAB_0011059e:
          uVar10 = uVar28;
          puVar21 = (ulong *)((long)plVar17 + uVar18 + 4);
          puVar33 = (ulong *)((long)piVar19 + uVar18 + 4);
          puVar31 = puVar21;
          if (puVar21 < puVar1) {
            uVar27 = *puVar21 ^ *puVar33;
            uVar30 = 0;
            if (uVar27 != 0) {
              for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
              }
            }
            uVar30 = uVar30 >> 3 & 0x1fffffff;
            if (*puVar33 == *puVar21) {
              puVar31 = (ulong *)((long)plVar17 + uVar18 + 0xc);
              puVar33 = (ulong *)((long)piVar19 + uVar18 + 0xc);
              do {
                if (puVar1 <= puVar31) goto LAB_0011061e;
                uVar27 = *puVar33;
                uVar34 = *puVar31;
                uVar20 = uVar34 ^ uVar27;
                uVar30 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                  }
                }
                uVar30 = (long)puVar31 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar21);
                puVar31 = puVar31 + 1;
                puVar33 = puVar33 + 1;
              } while (uVar27 == uVar34);
            }
          }
          else {
LAB_0011061e:
            if ((puVar31 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar33 == (int)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 4);
              puVar33 = (ulong *)((long)puVar33 + 4);
            }
            if ((puVar31 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar33 == (short)*puVar31)) {
              puVar31 = (ulong *)((long)puVar31 + 2);
              puVar33 = (ulong *)((long)puVar33 + 2);
            }
            if (puVar31 < puVar2) {
              puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar33 == (char)*puVar31));
            }
            uVar30 = (long)puVar31 - (long)puVar21;
          }
          uVar27 = (long)plVar17 - (long)src;
          plVar25 = (long *)seqStore->lit;
          plVar22 = (long *)((long)plVar25 + uVar27);
          do {
            *plVar25 = *src;
            plVar25 = plVar25 + 1;
            src = (void *)((long)src + 8);
          } while (plVar25 < plVar22);
          seqStore->lit = seqStore->lit + uVar27;
          if (0xffff < uVar27) {
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
          uVar34 = (uVar18 + 4 + uVar30) - 3;
          psVar8 = seqStore->sequences;
          psVar8->litLength = (U16)uVar27;
          psVar8->offset = iVar15 + 1;
          if (0xffff < uVar34) {
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
          }
          lVar24 = uVar18 + 4 + uVar30;
          psVar8->matchLength = (U16)uVar34;
          seqStore->sequences = psVar8 + 1;
          plVar22 = (long *)((long)plVar17 + lVar24);
          plVar25 = (long *)((long)plVar17 + lVar24 + 1);
          src = plVar22;
          if (plVar22 <= plVar13) {
            pUVar7[(ulong)(*(long *)(pBVar6 + (uVar36 & 0xffffffff) + 2) * -0x30e44323405a9d00) >>
                   (bVar14 & 0x3f)] = UVar35 + 2;
            pUVar7[(ulong)(*(long *)((long)plVar22 - 2) * -0x30e44323405a9d00) >> (bVar14 & 0x3f)] =
                 ((int)plVar22 + -2) - local_a8;
            if ((local_ac != 0) &&
               (uVar18 = (ulong)local_ac, (int)*plVar22 == *(int *)((long)plVar22 - uVar18))) {
              do {
                local_ac = uVar10;
                plVar25 = plVar22;
                uVar10 = (uint)uVar18;
                puVar31 = (ulong *)((long)plVar25 + 4);
                puVar33 = (ulong *)((long)plVar25 + (4 - uVar18));
                puVar21 = puVar31;
                if (puVar31 < puVar1) {
                  uVar36 = *puVar31 ^ *puVar33;
                  uVar30 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = uVar30 >> 3 & 0x1fffffff;
                  if (*puVar33 == *puVar31) {
                    puVar21 = (ulong *)((long)plVar25 + 0xc);
                    puVar33 = (ulong *)((long)plVar25 + (0xc - uVar18));
                    do {
                      if (puVar1 <= puVar21) goto LAB_001107ea;
                      uVar18 = *puVar33;
                      uVar36 = *puVar21;
                      uVar27 = uVar36 ^ uVar18;
                      uVar30 = 0;
                      if (uVar27 != 0) {
                        for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                        }
                      }
                      uVar30 = (long)puVar21 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar31);
                      puVar21 = puVar21 + 1;
                      puVar33 = puVar33 + 1;
                    } while (uVar18 == uVar36);
                  }
                }
                else {
LAB_001107ea:
                  if ((puVar21 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar33 == (int)*puVar21))
                  {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar21 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar33 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar21 < puVar2) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar33 == (char)*puVar21));
                  }
                  uVar30 = (long)puVar21 - (long)puVar31;
                }
                pUVar7[(ulong)(*plVar25 * -0x30e44323405a9d00) >> (bVar14 & 0x3f)] =
                     (int)plVar25 - local_a8;
                *(long *)seqStore->lit = *plVar25;
                psVar8 = seqStore->sequences;
                psVar8->litLength = 0;
                psVar8->offset = 1;
                if (0xffff < uVar30 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar22 = (long *)((long)plVar25 + uVar30 + 4);
                psVar8->matchLength = (U16)(uVar30 + 1);
                seqStore->sequences = psVar8 + 1;
              } while (((plVar22 <= plVar13) && (local_ac != 0)) &&
                      (uVar18 = (ulong)local_ac,
                      (int)*plVar22 == *(int *)((long)plVar22 - (ulong)local_ac)));
              plVar25 = (long *)((long)plVar25 + uVar30 + 5);
              src = plVar22;
            }
          }
        }
      } while (plVar25 < plVar13);
    }
  }
  else if (plVar25 < plVar13) {
    bVar14 = 0x20 - (char)(ms->cParams).hashLog;
    puVar1 = (ulong *)((long)puVar2 - 7);
    do {
      lVar24 = *plVar22;
      uVar16 = (uint)((int)lVar24 * -0x61c8864f) >> (bVar14 & 0x1f);
      lVar9 = *plVar25;
      uVar29 = (uint)((int)lVar9 * -0x61c8864f) >> (bVar14 & 0x1f);
      uVar18 = (long)plVar22 - (long)pBVar6;
      uVar28 = pUVar7[uVar16];
      uVar5 = pUVar7[uVar29];
      UVar35 = (U32)uVar18;
      pUVar7[uVar16] = UVar35;
      pUVar7[uVar29] = (int)plVar25 - local_a8;
      if (uVar10 == 0) {
LAB_00111319:
        if (((uVar11 < uVar28) &&
            (piVar19 = (int *)(pBVar6 + uVar28), plVar17 = plVar22, *piVar19 == (int)lVar24)) ||
           ((uVar11 < uVar5 &&
            (piVar19 = (int *)(pBVar6 + uVar5), plVar17 = plVar25, *piVar19 == (int)lVar9)))) {
          uVar28 = (int)plVar17 - (int)piVar19;
          iVar15 = uVar28 + 2;
          local_ac = uVar10;
          if ((piVar23 < piVar19) && (src < plVar17)) {
            uVar30 = 0;
            do {
              piVar32 = (int *)((long)piVar19 + -1);
              plVar22 = (long *)((long)plVar17 + -1);
              if ((*(char *)plVar22 != *(char *)piVar32) ||
                 (uVar30 = uVar30 + 1, plVar17 = plVar22, piVar19 = piVar32, piVar32 <= piVar23))
              break;
            } while (src < plVar22);
          }
          else {
            uVar30 = 0;
          }
          goto LAB_001113d5;
        }
        lVar24 = ((long)plVar22 - (long)src >> 7) + uVar12;
        plVar22 = (long *)((long)plVar22 + lVar24);
        plVar25 = (long *)((long)plVar25 + lVar24);
      }
      else {
        piVar19 = (int *)((long)plVar22 + (2 - (ulong)uVar10));
        if (*piVar19 != *(int *)((long)plVar22 + 2)) goto LAB_00111319;
        uVar30 = (ulong)(*(char *)((long)plVar22 + 1) == *(char *)((long)piVar19 + -1));
        iVar15 = 0;
        plVar17 = (long *)((long)plVar22 + (2 - uVar30));
        piVar19 = (int *)((long)piVar19 - uVar30);
        uVar28 = uVar10;
LAB_001113d5:
        uVar10 = uVar28;
        puVar21 = (ulong *)((long)plVar17 + uVar30 + 4);
        puVar33 = (ulong *)((long)piVar19 + uVar30 + 4);
        puVar31 = puVar21;
        if (puVar21 < puVar1) {
          uVar27 = *puVar21 ^ *puVar33;
          uVar36 = 0;
          if (uVar27 != 0) {
            for (; (uVar27 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
            }
          }
          uVar36 = uVar36 >> 3 & 0x1fffffff;
          if (*puVar33 == *puVar21) {
            puVar31 = (ulong *)((long)plVar17 + uVar30 + 0xc);
            puVar33 = (ulong *)((long)piVar19 + uVar30 + 0xc);
            do {
              if (puVar1 <= puVar31) goto LAB_00111455;
              uVar27 = *puVar33;
              uVar34 = *puVar31;
              uVar20 = uVar34 ^ uVar27;
              uVar36 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar36 & 1) == 0; uVar36 = uVar36 + 1) {
                }
              }
              uVar36 = (long)puVar31 + ((uVar36 >> 3 & 0x1fffffff) - (long)puVar21);
              puVar31 = puVar31 + 1;
              puVar33 = puVar33 + 1;
            } while (uVar27 == uVar34);
          }
        }
        else {
LAB_00111455:
          if ((puVar31 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar33 == (int)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 4);
            puVar33 = (ulong *)((long)puVar33 + 4);
          }
          if ((puVar31 < (ulong *)((long)puVar2 - 1U)) && ((short)*puVar33 == (short)*puVar31)) {
            puVar31 = (ulong *)((long)puVar31 + 2);
            puVar33 = (ulong *)((long)puVar33 + 2);
          }
          if (puVar31 < puVar2) {
            puVar31 = (ulong *)((long)puVar31 + (ulong)((char)*puVar33 == (char)*puVar31));
          }
          uVar36 = (long)puVar31 - (long)puVar21;
        }
        uVar27 = (long)plVar17 - (long)src;
        plVar25 = (long *)seqStore->lit;
        plVar22 = (long *)((long)plVar25 + uVar27);
        do {
          *plVar25 = *src;
          plVar25 = plVar25 + 1;
          src = (void *)((long)src + 8);
        } while (plVar25 < plVar22);
        seqStore->lit = seqStore->lit + uVar27;
        if (0xffff < uVar27) {
          seqStore->longLengthID = 1;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        uVar34 = (uVar30 + 4 + uVar36) - 3;
        psVar8 = seqStore->sequences;
        psVar8->litLength = (U16)uVar27;
        psVar8->offset = iVar15 + 1;
        if (0xffff < uVar34) {
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
        }
        lVar24 = uVar30 + 4 + uVar36;
        psVar8->matchLength = (U16)uVar34;
        seqStore->sequences = psVar8 + 1;
        plVar22 = (long *)((long)plVar17 + lVar24);
        plVar25 = (long *)((long)plVar17 + lVar24 + 1);
        src = plVar22;
        if (plVar22 <= plVar13) {
          pUVar7[(uint)(*(int *)(pBVar6 + (uVar18 & 0xffffffff) + 2) * -0x61c8864f) >>
                 (bVar14 & 0x1f)] = UVar35 + 2;
          pUVar7[(uint)(*(int *)((long)plVar22 - 2) * -0x61c8864f) >> (bVar14 & 0x1f)] =
               ((int)plVar22 + -2) - local_a8;
          if (local_ac != 0) {
            uVar18 = (ulong)local_ac;
            iVar15 = (int)*plVar22;
            uVar28 = uVar10;
            if (iVar15 == *(int *)((long)plVar22 - uVar18)) {
              do {
                uVar10 = local_ac;
                local_ac = uVar28;
                plVar25 = plVar22;
                puVar31 = (ulong *)((long)plVar25 + 4);
                puVar33 = (ulong *)((long)plVar25 + (4 - uVar18));
                puVar21 = puVar31;
                if (puVar31 < puVar1) {
                  uVar36 = *puVar31 ^ *puVar33;
                  uVar30 = 0;
                  if (uVar36 != 0) {
                    for (; (uVar36 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                    }
                  }
                  uVar30 = uVar30 >> 3 & 0x1fffffff;
                  if (*puVar33 == *puVar31) {
                    puVar21 = (ulong *)((long)plVar25 + 0xc);
                    puVar33 = (ulong *)((long)plVar25 + (0xc - uVar18));
                    do {
                      if (puVar1 <= puVar21) goto LAB_0011161b;
                      uVar18 = *puVar33;
                      uVar36 = *puVar21;
                      uVar27 = uVar36 ^ uVar18;
                      uVar30 = 0;
                      if (uVar27 != 0) {
                        for (; (uVar27 >> uVar30 & 1) == 0; uVar30 = uVar30 + 1) {
                        }
                      }
                      uVar30 = (long)puVar21 + ((uVar30 >> 3 & 0x1fffffff) - (long)puVar31);
                      puVar21 = puVar21 + 1;
                      puVar33 = puVar33 + 1;
                    } while (uVar18 == uVar36);
                  }
                }
                else {
LAB_0011161b:
                  if ((puVar21 < (ulong *)((long)puVar2 - 3U)) && ((int)*puVar33 == (int)*puVar21))
                  {
                    puVar21 = (ulong *)((long)puVar21 + 4);
                    puVar33 = (ulong *)((long)puVar33 + 4);
                  }
                  if ((puVar21 < (ulong *)((long)puVar2 - 1U)) &&
                     ((short)*puVar33 == (short)*puVar21)) {
                    puVar21 = (ulong *)((long)puVar21 + 2);
                    puVar33 = (ulong *)((long)puVar33 + 2);
                  }
                  if (puVar21 < puVar2) {
                    puVar21 = (ulong *)((long)puVar21 + (ulong)((char)*puVar33 == (char)*puVar21));
                  }
                  uVar30 = (long)puVar21 - (long)puVar31;
                }
                pUVar7[(uint)(iVar15 * -0x61c8864f) >> (bVar14 & 0x1f)] = (int)plVar25 - local_a8;
                *(long *)seqStore->lit = *plVar25;
                psVar8 = seqStore->sequences;
                psVar8->litLength = 0;
                psVar8->offset = 1;
                if (0xffff < uVar30 + 1) {
                  seqStore->longLengthID = 2;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)psVar8 - (long)seqStore->sequencesStart) >> 3);
                }
                plVar22 = (long *)((long)plVar25 + uVar30 + 4);
                psVar8->matchLength = (U16)(uVar30 + 1);
                seqStore->sequences = psVar8 + 1;
              } while (((plVar22 <= plVar13) && (local_ac != 0)) &&
                      (iVar15 = (int)*plVar22, uVar28 = uVar10, uVar18 = (ulong)local_ac,
                      iVar15 == *(int *)((long)plVar22 - (ulong)local_ac)));
              plVar25 = (long *)((long)plVar25 + uVar30 + 5);
              src = plVar22;
            }
          }
        }
      }
    } while (plVar25 < plVar13);
  }
  uVar11 = 0;
  if (uVar26 < uVar3) {
    uVar11 = uVar3;
  }
  if (uVar26 < uVar4) {
    uVar11 = uVar4;
  }
  if (uVar10 == 0) {
    uVar10 = uVar11;
  }
  if (local_ac != 0) {
    uVar11 = local_ac;
  }
  *rep = uVar10;
  rep[1] = uVar11;
  return (long)puVar2 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_fast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    ZSTD_compressionParameters const* cParams = &ms->cParams;
    U32 const mls = cParams->minMatch;
    assert(ms->dictMatchState == NULL);
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 4);
    case 5 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 5);
    case 6 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 6);
    case 7 :
        return ZSTD_compressBlock_fast_generic(ms, seqStore, rep, src, srcSize, 7);
    }
}